

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O3

void anon_unknown.dwarf_62f9fb::init_curious_in_channel(Caliper *c,Channel *channel)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Hash_node_base *p_Var3;
  curious_t curious_inst;
  Events *pEVar4;
  _Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false> usr_args;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base **pp_Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  size_type __n;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  pointer __ptr;
  undefined1 auVar12 [16];
  __buckets_alloc_type __alloc;
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  data;
  new_allocator<std::__detail::_Hash_node_base_*> local_59;
  __uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  local_58;
  undefined8 local_50;
  _Hash_node_base *local_48;
  __uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  local_40;
  Caliper *local_38;
  
  local_38 = c;
  pEVar4 = cali::Channel::events(channel);
  cali::util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
            (&pEVar4->subscribe_attribute,&local_38,
             (Attribute *)&(anonymous_namespace)::io_region_attr);
  curious_inst = curious_init(3);
  usr_args._M_head_impl = (user_data_t *)operator_new(0x18);
  peVar1 = (channel->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (channel->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (usr_args._M_head_impl)->curious_ctx = curious_inst;
  ((usr_args._M_head_impl)->channel).mP.
  super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  ((usr_args._M_head_impl)->channel).mP.
  super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_58._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )(tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )usr_args._M_head_impl;
  curious_register_callback(curious_inst,0,handle_io<curious_read_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,1,handle_io<curious_read_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,2,handle_io<curious_write_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,3,handle_io<curious_write_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,4,handle_io<curious_metadata_record>,usr_args._M_head_impl)
  ;
  curious_register_callback(curious_inst,5,handle_io<curious_metadata_record>,usr_args._M_head_impl)
  ;
  p_Var5 = (_Hash_node_base *)cali::Channel::id(channel);
  local_58._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )0x0;
  local_48 = p_Var5;
  local_40._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )(tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )usr_args._M_head_impl;
  p_Var6 = (_Hash_node_base *)operator_new(0x18);
  p_Var6->_M_nxt = (_Hash_node_base *)0x0;
  p_Var6[1]._M_nxt = p_Var5;
  p_Var6[2]._M_nxt = (_Hash_node_base *)usr_args._M_head_impl;
  local_40._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )0x0;
  uVar9 = (ulong)p_Var5 % DAT_00281500;
  if ((anonymous_namespace)::curious_insts[uVar9] != (_Hash_node_base *)0x0) {
    p_Var11 = (anonymous_namespace)::curious_insts[uVar9]->_M_nxt;
    p_Var3 = p_Var11[1]._M_nxt;
    do {
      if (p_Var3 == p_Var5) {
        std::
        unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                       *)(p_Var6 + 2));
        operator_delete(p_Var6,0x18);
        goto LAB_0021c69e;
      }
      p_Var11 = p_Var11->_M_nxt;
    } while ((p_Var11 != (_Hash_node_base *)0x0) &&
            (p_Var3 = p_Var11[1]._M_nxt, (ulong)p_Var3 % DAT_00281500 == uVar9));
  }
  local_50 = DAT_00281520;
  auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash(0x281518,DAT_00281500,DAT_00281510);
  __n = auVar12._8_8_;
  if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (__n == 1) {
      _DAT_00281528 = 0;
      pp_Var7 = (_Hash_node_base **)&DAT_00281528;
    }
    else {
      pp_Var7 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          (&local_59,__n,(void *)0x0);
      memset(pp_Var7,0,__n * 8);
    }
    p_Var11 = DAT_00281508;
    DAT_00281508 = (_Hash_node_base *)0x0;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      uVar9 = 0;
      do {
        p_Var3 = p_Var11->_M_nxt;
        uVar10 = (ulong)p_Var11[1]._M_nxt % __n;
        if (pp_Var7[uVar10] == (_Hash_node_base *)0x0) {
          p_Var11->_M_nxt = DAT_00281508;
          DAT_00281508 = p_Var11;
          pp_Var7[uVar10] = (_Hash_node_base *)&DAT_00281508;
          if (p_Var11->_M_nxt != (_Hash_node_base *)0x0) {
            p_Var8 = (_Hash_node_base *)(pp_Var7 + uVar9);
            goto LAB_0021c5f5;
          }
        }
        else {
          p_Var11->_M_nxt = pp_Var7[uVar10]->_M_nxt;
          p_Var8 = pp_Var7[uVar10];
          uVar10 = uVar9;
LAB_0021c5f5:
          p_Var8->_M_nxt = p_Var11;
        }
        p_Var11 = p_Var3;
        uVar9 = uVar10;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    if ((anonymous_namespace)::curious_insts != (_Hash_node_base **)&DAT_00281528) {
      operator_delete((anonymous_namespace)::curious_insts,DAT_00281500 << 3);
    }
    uVar9 = (ulong)p_Var5 % __n;
    (anonymous_namespace)::curious_insts = pp_Var7;
    DAT_00281500 = __n;
  }
  pp_Var7 = (anonymous_namespace)::curious_insts;
  if ((anonymous_namespace)::curious_insts[uVar9] == (_Hash_node_base *)0x0) {
    p_Var6->_M_nxt = DAT_00281508;
    if (DAT_00281508 != (_Hash_node_base *)0x0) {
      p_Var5 = DAT_00281508 + 1;
      DAT_00281508 = p_Var6;
      pp_Var7[(ulong)p_Var5->_M_nxt % DAT_00281500] = p_Var6;
      pp_Var7 = (anonymous_namespace)::curious_insts;
      p_Var6 = DAT_00281508;
    }
    DAT_00281508 = p_Var6;
    pp_Var7[uVar9] = (_Hash_node_base *)&DAT_00281508;
  }
  else {
    p_Var6->_M_nxt = (anonymous_namespace)::curious_insts[uVar9]->_M_nxt;
    pp_Var7[uVar9]->_M_nxt = p_Var6;
  }
  DAT_00281510 = DAT_00281510 + 1;
LAB_0021c69e:
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                 *)&local_40);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                 *)&local_58);
  return;
}

Assistant:

void init_curious_in_channel(Caliper* c, Channel* channel)
{
    channel->events().subscribe_attribute(c, io_region_attr);

    curious_t curious_inst = curious_init(CURIOUS_ALL_APIS);
    auto      data         = std::unique_ptr<user_data_t>(new user_data_t { curious_inst, *channel });

    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );

    curious_insts.insert(std::make_pair(channel->id(), std::move(data)));
}